

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

OutputInfo * __thiscall cmGeneratorTarget::GetOutputInfo(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  iterator iVar2;
  cmake *this_00;
  OutputInfo *pOVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>_>,_bool>
  pVar4;
  allocator<char> local_141;
  undefined1 local_140 [32];
  string config_upper;
  OutputInfo info;
  string msg;
  
  if (this->Target->IsImportedTarget != false) {
    return (OutputInfo *)0x0;
  }
  if (OBJECT_LIBRARY < this->Target->TargetTypeValue) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&msg,"cmGeneratorTarget::GetOutputInfo called for ",
               (allocator<char> *)&info);
    std::__cxx11::string::append((string *)&msg);
    std::__cxx11::string::append((char *)&msg);
    cmState::GetTargetTypeName(this->Target->TargetTypeValue);
    std::__cxx11::string::append((char *)&msg);
    cmLocalGenerator::IssueMessage(this->LocalGenerator,INTERNAL_ERROR,&msg);
    std::__cxx11::string::~string((string *)&msg);
    return (OutputInfo *)0x0;
  }
  config_upper._M_dataplus._M_p = (pointer)&config_upper.field_2;
  config_upper._M_string_length = 0;
  config_upper.field_2._M_local_buf[0] = '\0';
  if (config->_M_string_length != 0) {
    cmsys::SystemTools::UpperCase(&msg,config);
    std::__cxx11::string::operator=((string *)&config_upper,(string *)&msg);
    std::__cxx11::string::~string((string *)&msg);
  }
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>_>_>
          ::find(&(this->OutputInfoMap)._M_t,&config_upper);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->OutputInfoMap)._M_t._M_impl.super__Rb_tree_header)
  {
    info.OutDir._M_dataplus._M_p = (pointer)&info.OutDir.field_2;
    info.OutDir._M_string_length = 0;
    info.OutDir.field_2._M_local_buf[0] = '\0';
    info.ImpDir._M_dataplus._M_p = (pointer)&info.ImpDir.field_2;
    info.ImpDir._M_string_length = 0;
    info.ImpDir.field_2._M_local_buf[0] = '\0';
    info.PdbDir._M_dataplus._M_p = (pointer)&info.PdbDir.field_2;
    info.PdbDir._M_string_length = 0;
    info.PdbDir.field_2._M_local_buf[0] = '\0';
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmGeneratorTarget::OutputInfo_&,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>
                *)&msg,&config_upper,&info);
    pVar4 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGeneratorTarget::OutputInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGeneratorTarget::OutputInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::OutputInfo>>>
            ::
            _M_emplace_unique<std::pair<std::__cxx11::string_const,cmGeneratorTarget::OutputInfo>&>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGeneratorTarget::OutputInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGeneratorTarget::OutputInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::OutputInfo>>>
                        *)&this->OutputInfoMap,
                       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>
                        *)&msg);
    iVar2._M_node = (_Base_ptr)pVar4.first._M_node;
    ComputeOutputDir(this,config,RuntimeBinaryArtifact,&info.OutDir);
    ComputeOutputDir(this,config,ImportLibraryArtifact,&info.ImpDir);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_140,"PDB",&local_141);
    bVar1 = ComputePDBOutputDir(this,(string *)local_140,config,&info.PdbDir);
    std::__cxx11::string::~string((string *)local_140);
    if (!bVar1) {
      std::__cxx11::string::_M_assign((string *)&info.PdbDir);
    }
    OutputInfo::operator=((OutputInfo *)(iVar2._M_node + 2),&info);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>
             *)&msg);
    OutputInfo::~OutputInfo(&info);
  }
  else {
    bVar1 = OutputInfo::empty((OutputInfo *)(iVar2._M_node + 2));
    if (bVar1) {
      this_00 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
      std::operator+(&info.OutDir,"Target \'",&this->Target->Name);
      std::operator+(&msg,&info.OutDir,"\' OUTPUT_DIRECTORY depends on itself.");
      GetBacktrace((cmGeneratorTarget *)local_140);
      cmake::IssueMessage(this_00,FATAL_ERROR,&msg,(cmListFileBacktrace *)local_140);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_140 + 8));
      std::__cxx11::string::~string((string *)&msg);
      std::__cxx11::string::~string((string *)&info);
      pOVar3 = (OutputInfo *)0x0;
      goto LAB_0015e065;
    }
  }
  pOVar3 = (OutputInfo *)(iVar2._M_node + 2);
LAB_0015e065:
  std::__cxx11::string::~string((string *)&config_upper);
  return pOVar3;
}

Assistant:

bool cmGeneratorTarget::IsImported() const
{
  return this->Target->IsImported();
}